

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O2

void predicate_suite::test_all_of(void)

{
  bool bVar1;
  difference_type dVar2;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  size_type extraout_RDX_02;
  size_type extraout_RDX_03;
  size_type extraout_RDX_04;
  size_type extraout_RDX_05;
  size_type extraout_RDX_06;
  size_type extraout_RDX_07;
  size_type extraout_RDX_08;
  size_type extraout_RDX_09;
  size_type extraout_RDX_10;
  size_type extraout_RDX_11;
  size_type extraout_RDX_12;
  size_type extraout_RDX_13;
  size_type extraout_RDX_14;
  size_type extraout_RDX_15;
  size_type extraout_RDX_16;
  size_type extraout_RDX_17;
  size_type extraout_RDX_18;
  size_type extraout_RDX_19;
  size_type extraout_RDX_20;
  size_type extraout_RDX_21;
  size_type extraout_RDX_22;
  size_type extraout_RDX_23;
  size_type sVar3;
  size_type extraout_RDX_24;
  size_type extraout_RDX_25;
  size_type extraout_RDX_26;
  size_type extraout_RDX_27;
  size_type extraout_RDX_28;
  size_type extraout_RDX_29;
  size_type extraout_RDX_30;
  basic_iterator<int> *pbVar4;
  long lVar5;
  basic_iterator<int> __it;
  basic_iterator<int> __it_00;
  basic_iterator<int> __it_01;
  basic_iterator<int> __it_02;
  basic_iterator<int> __it_03;
  basic_iterator<int> __it_04;
  basic_iterator<int> __it_05;
  basic_iterator<int> __it_06;
  basic_iterator<int> __it_07;
  basic_iterator<int> __it_08;
  basic_iterator<int> __it_09;
  basic_iterator<int> __it_10;
  basic_iterator<int> __it_11;
  basic_iterator<int> __it_12;
  basic_iterator<int> __it_13;
  basic_iterator<int> __it_14;
  basic_iterator<int> __it_15;
  basic_iterator<int> __it_16;
  basic_iterator<int> __it_17;
  basic_iterator<int> __it_18;
  basic_iterator<int> __it_19;
  basic_iterator<int> __it_20;
  basic_iterator<int> __it_21;
  basic_iterator<int> __it_22;
  basic_iterator<int> __it_23;
  basic_iterator<int> __it_24;
  basic_iterator<int> __it_25;
  basic_iterator<int> __it_26;
  iterator iVar6;
  iterator local_98;
  iterator local_88;
  iterator local_78;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0xb);
  iVar6 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  local_98 = iVar6;
  local_78 = local_88;
  dVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator-
                    (&local_78,&local_98);
  sVar3 = extraout_RDX;
  for (lVar5 = dVar2 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    __it.current = sVar3;
    __it.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_0>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__0> *)local_98.parent,__it);
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103425;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    __it_00.current = extraout_RDX_00;
    __it_00.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_0>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__0> *)local_98.parent,__it_00)
    ;
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103425;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    __it_01.current = extraout_RDX_01;
    __it_01.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_0>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__0> *)local_98.parent,__it_01)
    ;
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103425;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    __it_02.current = extraout_RDX_02;
    __it_02.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_0>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__0> *)local_98.parent,__it_02)
    ;
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103425;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    sVar3 = extraout_RDX_03;
  }
  dVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator-
                    (&local_78,&local_98);
  sVar3 = extraout_RDX_09;
  if (dVar2 == 1) {
LAB_0010359a:
    __it_09.current = sVar3;
    __it_09.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_0>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__0> *)local_98.parent,__it_09)
    ;
    pbVar4 = &local_98;
    if (!bVar1) {
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      pbVar4 = &local_78;
    }
  }
  else if (dVar2 == 2) {
LAB_0010357c:
    __it_08.current = sVar3;
    __it_08.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_0>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__0> *)local_98.parent,__it_08)
    ;
    pbVar4 = &local_98;
    if (!bVar1) {
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      sVar3 = extraout_RDX_11;
      goto LAB_0010359a;
    }
  }
  else {
    pbVar4 = &local_78;
    if (dVar2 == 3) {
      __it_07.current = extraout_RDX_09;
      __it_07.parent = (view_pointer)local_98.current;
      bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_0>::operator()
                        ((_Iter_negate<predicate_suite::test_all_of()::__0> *)local_98.parent,
                         __it_07);
      pbVar4 = &local_98;
      if (!bVar1) {
        vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
                  (&local_98);
        sVar3 = extraout_RDX_10;
        goto LAB_0010357c;
      }
    }
  }
LAB_00103425:
  local_98 = *pbVar4;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_88,&local_98);
  boost::detail::test_impl
            ("std::all_of(span.begin(), span.end(), [] (int current) { return current == 11; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1a1,"void predicate_suite::test_all_of()",bVar1);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0xb);
  iVar6 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  local_98 = iVar6;
  local_78 = local_88;
  dVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator-
                    (&local_78,&local_98);
  sVar3 = extraout_RDX_04;
  for (lVar5 = dVar2 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    __it_03.current = sVar3;
    __it_03.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_1>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__1> *)local_98.parent,__it_03)
    ;
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103631;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    __it_04.current = extraout_RDX_05;
    __it_04.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_1>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__1> *)local_98.parent,__it_04)
    ;
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103631;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    __it_05.current = extraout_RDX_06;
    __it_05.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_1>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__1> *)local_98.parent,__it_05)
    ;
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103631;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    __it_06.current = extraout_RDX_07;
    __it_06.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_1>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__1> *)local_98.parent,__it_06)
    ;
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103631;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    sVar3 = extraout_RDX_08;
  }
  dVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator-
                    (&local_78,&local_98);
  sVar3 = extraout_RDX_12;
  if (dVar2 == 1) {
LAB_00103614:
    __it_12.current = sVar3;
    __it_12.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_1>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__1> *)local_98.parent,__it_12)
    ;
    pbVar4 = &local_98;
    if (!bVar1) {
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      pbVar4 = &local_78;
    }
  }
  else if (dVar2 == 2) {
LAB_001035fa:
    __it_11.current = sVar3;
    __it_11.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_1>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__1> *)local_98.parent,__it_11)
    ;
    pbVar4 = &local_98;
    if (!bVar1) {
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      sVar3 = extraout_RDX_14;
      goto LAB_00103614;
    }
  }
  else {
    pbVar4 = &local_78;
    if (dVar2 == 3) {
      __it_10.current = extraout_RDX_12;
      __it_10.parent = (view_pointer)local_98.current;
      bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_1>::operator()
                        ((_Iter_negate<predicate_suite::test_all_of()::__1> *)local_98.parent,
                         __it_10);
      pbVar4 = &local_98;
      if (!bVar1) {
        vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
                  (&local_98);
        sVar3 = extraout_RDX_13;
        goto LAB_001035fa;
      }
    }
  }
LAB_00103631:
  local_98 = *pbVar4;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_88,&local_98);
  boost::detail::test_impl
            ("std::all_of(span.begin(), span.end(), [] (int current) { return current == 11; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1a3,"void predicate_suite::test_all_of()",bVar1);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x37);
  iVar6 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  local_98 = iVar6;
  local_78 = local_88;
  dVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator-
                    (&local_78,&local_98);
  sVar3 = extraout_RDX_15;
  for (lVar5 = dVar2 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    __it_13.current = sVar3;
    __it_13.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_2>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__2> *)local_98.parent,__it_13)
    ;
    pbVar4 = &local_98;
    if (bVar1) goto LAB_001037ae;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    __it_14.current = extraout_RDX_16;
    __it_14.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_2>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__2> *)local_98.parent,__it_14)
    ;
    pbVar4 = &local_98;
    if (bVar1) goto LAB_001037ae;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    __it_15.current = extraout_RDX_17;
    __it_15.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_2>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__2> *)local_98.parent,__it_15)
    ;
    pbVar4 = &local_98;
    if (bVar1) goto LAB_001037ae;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    __it_16.current = extraout_RDX_18;
    __it_16.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_2>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__2> *)local_98.parent,__it_16)
    ;
    pbVar4 = &local_98;
    if (bVar1) goto LAB_001037ae;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    sVar3 = extraout_RDX_19;
  }
  dVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator-
                    (&local_78,&local_98);
  sVar3 = extraout_RDX_20;
  if (dVar2 == 1) {
LAB_00103791:
    __it_19.current = sVar3;
    __it_19.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_2>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__2> *)local_98.parent,__it_19)
    ;
    pbVar4 = &local_98;
    if (!bVar1) {
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      pbVar4 = &local_78;
    }
  }
  else if (dVar2 == 2) {
LAB_00103777:
    __it_18.current = sVar3;
    __it_18.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_2>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__2> *)local_98.parent,__it_18)
    ;
    pbVar4 = &local_98;
    if (!bVar1) {
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      sVar3 = extraout_RDX_22;
      goto LAB_00103791;
    }
  }
  else {
    pbVar4 = &local_78;
    if (dVar2 == 3) {
      __it_17.current = extraout_RDX_20;
      __it_17.parent = (view_pointer)local_98.current;
      bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_2>::operator()
                        ((_Iter_negate<predicate_suite::test_all_of()::__2> *)local_98.parent,
                         __it_17);
      pbVar4 = &local_98;
      if (!bVar1) {
        vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
                  (&local_98);
        sVar3 = extraout_RDX_21;
        goto LAB_00103777;
      }
    }
  }
LAB_001037ae:
  local_98 = *pbVar4;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_88,&local_98);
  boost::detail::test_impl
            ("!std::all_of(span.begin(), span.end(), [] (int current) { return current == 11; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1a5,"void predicate_suite::test_all_of()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x37);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x37);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x37);
  iVar6 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  local_98 = iVar6;
  local_78 = local_88;
  dVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator-
                    (&local_78,&local_98);
  sVar3 = extraout_RDX_23;
  for (lVar5 = dVar2 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    __it_20.current = sVar3;
    __it_20.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_3>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__3> *)local_98.parent,__it_20)
    ;
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103945;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    __it_21.current = extraout_RDX_24;
    __it_21.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_3>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__3> *)local_98.parent,__it_21)
    ;
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103945;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    __it_22.current = extraout_RDX_25;
    __it_22.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_3>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__3> *)local_98.parent,__it_22)
    ;
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103945;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    __it_23.current = extraout_RDX_26;
    __it_23.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_3>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__3> *)local_98.parent,__it_23)
    ;
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103945;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    sVar3 = extraout_RDX_27;
  }
  dVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator-
                    (&local_78,&local_98);
  sVar3 = extraout_RDX_28;
  if (dVar2 != 1) {
    if (dVar2 != 2) {
      pbVar4 = &local_78;
      if (dVar2 != 3) goto LAB_00103945;
      __it_24.current = extraout_RDX_28;
      __it_24.parent = (view_pointer)local_98.current;
      bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_3>::operator()
                        ((_Iter_negate<predicate_suite::test_all_of()::__3> *)local_98.parent,
                         __it_24);
      pbVar4 = &local_98;
      if (bVar1) goto LAB_00103945;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      sVar3 = extraout_RDX_29;
    }
    __it_25.current = sVar3;
    __it_25.parent = (view_pointer)local_98.current;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_3>::operator()
                      ((_Iter_negate<predicate_suite::test_all_of()::__3> *)local_98.parent,__it_25)
    ;
    pbVar4 = &local_98;
    if (bVar1) goto LAB_00103945;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    sVar3 = extraout_RDX_30;
  }
  __it_26.current = sVar3;
  __it_26.parent = (view_pointer)local_98.current;
  bVar1 = __gnu_cxx::__ops::_Iter_negate<predicate_suite::test_all_of()::$_3>::operator()
                    ((_Iter_negate<predicate_suite::test_all_of()::__3> *)local_98.parent,__it_26);
  pbVar4 = &local_98;
  if (!bVar1) {
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    pbVar4 = &local_78;
  }
LAB_00103945:
  local_98 = *pbVar4;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_88,&local_98);
  boost::detail::test_impl
            ("std::all_of(span.begin(), span.end(), [] (int current) { return current == 55; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1a9,"void predicate_suite::test_all_of()",bVar1);
  return;
}

Assistant:

void test_all_of()
{
    int array[4] = {};
    circular_view<int> span(array);
    span.push_back(11);
    BOOST_TEST(std::all_of(span.begin(), span.end(), [] (int current) { return current == 11; }));
    span.push_back(11);
    BOOST_TEST(std::all_of(span.begin(), span.end(), [] (int current) { return current == 11; }));
    span.push_back(55);
    BOOST_TEST(!std::all_of(span.begin(), span.end(), [] (int current) { return current == 11; }));
    span.push_back(55);
    span.push_back(55);
    span.push_back(55);
    BOOST_TEST(std::all_of(span.begin(), span.end(), [] (int current) { return current == 55; }));
}